

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitNumericConstant
          (ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,NumericConstant c)

{
  FormatSpec local_18;
  
  local_18.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_18.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_18.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_18.flags_ = 0;
  local_18.precision_ = -1;
  local_18.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>
            (this->writer_,
             *(double *)
              ((long)c.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_ +
              8),&local_18);
  return;
}

Assistant:

void VisitNumericConstant(NumericConstant c) { writer_ << c.value(); }